

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QDateTime * __thiscall QDateTime::operator=(QDateTime *this,QDateTime *other)

{
  uint uVar1;
  QDateTimePrivate *pQVar2;
  QDateTimePrivate *pQVar3;
  
  pQVar2 = (this->d).d;
  if (((ulong)pQVar2 & 1) == 0) {
    pQVar3 = (other->d).d;
  }
  else {
    pQVar3 = (other->d).d;
  }
  if (pQVar3 != pQVar2) {
    (this->d).d = pQVar3;
    pQVar3 = (other->d).d;
    if (((ulong)pQVar3 & 1) == 0) {
      uVar1 = (pQVar3->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
              super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
      if (((uVar1 & 0x20) == 0) && (pQVar3->m_msecs + 0x80000000000000U >> 0x38 == 0)) {
        (this->d).d = (QDateTimePrivate *)((ulong)(uVar1 & 0xde) + pQVar3->m_msecs * 0x100 + 1);
      }
      else {
        LOCK();
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)
              (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
    }
    if (((ulong)pQVar2 & 1) == 0) {
      LOCK();
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 0) {
        QTimeZone::~QTimeZone(&pQVar2->m_timeZone);
        operator_delete(pQVar2,0x20);
      }
    }
  }
  return this;
}

Assistant:

QDateTime &QDateTime::operator=(const QDateTime &other) noexcept
{
    d = other.d;
    return *this;
}